

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::MessageSetItemByteSize
                 (FieldDescriptor *field,Message *message)

{
  int iVar1;
  uint32 value;
  undefined4 extraout_var;
  size_t sVar2;
  long *plVar3;
  long lVar4;
  size_t sVar5;
  size_t message_size;
  Message *sub_message;
  size_t our_size;
  Reflection *message_reflection;
  Message *message_local;
  FieldDescriptor *field_local;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  value = FieldDescriptor::number(field);
  sVar2 = io::CodedOutputStream::VarintSize32(value);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xd8))
                             ((long *)CONCAT44(extraout_var,iVar1),message,field,0);
  lVar4 = (**(code **)(*plVar3 + 0x60))();
  sVar5 = io::CodedOutputStream::VarintSize32((uint32)lVar4);
  return lVar4 + sVar5 + sVar2 + 4;
}

Assistant:

size_t WireFormat::MessageSetItemByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(field->number());

  // message
  const Message& sub_message = message_reflection->GetMessage(message, field);
  size_t message_size = sub_message.ByteSizeLong();

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}